

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_control_main.c
# Opt level: O3

argparse_result_t argparse_cbk(char *short_name,char *long_name,char *value)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  adt_str_t *paVar5;
  adt_str_t **ppaVar6;
  char *end;
  char *local_20;
  
  if (value != (char *)0x0) {
    if (short_name == (char *)0x0) {
      if (long_name == (char *)0x0) {
        paVar5 = (adt_str_t *)adt_str_new_cstr(value);
        if (paVar5 == (adt_str_t *)0x0) {
          return ARGPARSE_MEM_ERROR;
        }
        if (m_pos_arg_count == 0) {
          ppaVar6 = &m_name;
        }
        else {
          if (m_pos_arg_count != 1) {
            adt_str_delete(paVar5);
            return ARGPARSE_PARSE_ERROR;
          }
          ppaVar6 = &m_value;
        }
        *ppaVar6 = paVar5;
        m_pos_arg_count = m_pos_arg_count + 1;
        return ARGPARSE_SUCCESS;
      }
      iVar3 = strcmp(long_name,"port");
      if (iVar3 != 0) {
        iVar3 = strcmp(long_name,"connect");
        if (iVar3 != 0) {
          return ARGPARSE_SUCCESS;
        }
        if (m_connect_address != (adt_str_t *)0x0) {
          adt_str_delete();
        }
        m_connect_resource_type = apx_parse_resource_name(value,&m_connect_address,&m_connect_port);
        if (m_connect_resource_type == '\x05') {
          return ARGPARSE_VALUE_ERROR;
        }
        return ((m_connect_resource_type != '\0') - 2) + (uint)(m_connect_resource_type != '\0');
      }
      lVar4 = strtol(value,&local_20,0);
      if (local_20 <= value || 0xffff < lVar4) {
        return ARGPARSE_VALUE_ERROR;
      }
    }
    else {
      cVar1 = *short_name;
      if (cVar1 == 'c') {
        if (short_name[1] != '\0') {
          return ARGPARSE_PARSE_ERROR;
        }
        if (m_connect_address != (adt_str_t *)0x0) {
          adt_str_delete();
        }
        m_connect_resource_type = apx_parse_resource_name(value,&m_connect_address,&m_connect_port);
        if (m_connect_resource_type == '\0') {
          return ARGPARSE_VALUE_ERROR;
        }
        if (m_connect_resource_type == '\x05') {
          return ARGPARSE_VALUE_ERROR;
        }
        return ARGPARSE_SUCCESS;
      }
      if (cVar1 == 'i') {
        if (short_name[1] != '\0') {
          return ARGPARSE_PARSE_ERROR;
        }
        m_input_file_path = (adt_str_t *)adt_str_new_cstr(value);
        if (m_input_file_path == (adt_str_t *)0x0) {
          return ARGPARSE_MEM_ERROR;
        }
        return ARGPARSE_SUCCESS;
      }
      if (cVar1 != 'p') {
        return ARGPARSE_PARSE_ERROR;
      }
      if (short_name[1] != '\0') {
        return ARGPARSE_PARSE_ERROR;
      }
      lVar4 = strtol(value,&local_20,0);
      if (0xffff < lVar4 || local_20 <= value) {
        return ARGPARSE_VALUE_ERROR;
      }
    }
    m_connect_port = (uint16_t)lVar4;
    return ARGPARSE_SUCCESS;
  }
  if (short_name != (char *)0x0) {
    bVar2 = *short_name;
    if (bVar2 < 0x69) {
      if (bVar2 != 99) {
        if (bVar2 != 0x68) {
          return ARGPARSE_NAME_ERROR;
        }
        if (short_name[1] == '\0') {
          m_display_help = 1;
          return ARGPARSE_SUCCESS;
        }
        return ARGPARSE_NAME_ERROR;
      }
    }
    else if ((bVar2 != 0x70) && (bVar2 != 0x69)) {
      return ARGPARSE_NAME_ERROR;
    }
    if (short_name[1] == '\0') {
      return ARGPARSE_NEED_VALUE;
    }
    return ARGPARSE_NAME_ERROR;
  }
  if (long_name == (char *)0x0) {
    return ARGPARSE_SUCCESS;
  }
  iVar3 = strcmp(long_name,"connect");
  if (iVar3 != 0) {
    iVar3 = strcmp(long_name,"port");
    if (iVar3 == 0) {
      return ARGPARSE_NEED_VALUE;
    }
    iVar3 = strcmp(long_name,"help");
    if (iVar3 == 0) {
      m_display_help = 1;
      return ARGPARSE_SUCCESS;
    }
    iVar3 = strcmp(long_name,"version");
    if (iVar3 != 0) {
      return ARGPARSE_NAME_ERROR;
    }
    m_display_version = 1;
    return ARGPARSE_SUCCESS;
  }
  return ARGPARSE_NEED_VALUE;
}

Assistant:

static argparse_result_t argparse_cbk(const char *short_name, const char *long_name, const char *value)
{
   if (value == 0)
   {
      if ( short_name != 0 )
      {
         if ( (strcmp(short_name,"i")==0) || (strcmp(short_name,"p")==0) ||
              (strcmp(short_name,"c")==0) )
         {
            return ARGPARSE_NEED_VALUE;
         }
         else if( (strcmp(short_name,"h")==0) )
         {
            m_display_help = true;
            return ARGPARSE_SUCCESS;
         }
         else
         {
            return ARGPARSE_NAME_ERROR;
         }
      }
      else if ( (long_name != 0) )
      {
         if ( (strcmp(long_name,"connect")==0) || (strcmp(long_name,"port")==0) )
         {
            return ARGPARSE_NEED_VALUE;
         }
         else if ( (strcmp(long_name,"help")==0) )
         {
            m_display_help = true;
            return ARGPARSE_SUCCESS;
         }
         else if ( (strcmp(long_name,"version")==0) )
         {
            m_display_version = true;
            return ARGPARSE_SUCCESS;
         }
         else
         {
            return ARGPARSE_NAME_ERROR;
         }
      }
   }
   else
   {
      if ( short_name != 0 )
      {
         char *end;
         long lval;
         if (strcmp(short_name,"p")==0)
         {
            lval = strtol(value, &end, 0);
            if ((end > value) && (lval <= UINT16_MAX))
            {
               m_connect_port = (uint16_t) lval;
            }
            else
            {
               return ARGPARSE_VALUE_ERROR;
            }
         }
         else if (strcmp(short_name,"c")==0)
         {
            if (m_connect_address != 0) adt_str_delete(m_connect_address);
            m_connect_resource_type = apx_parse_resource_name(value, &m_connect_address, &m_connect_port);
            if ( (m_connect_resource_type == APX_RESOURCE_TYPE_UNKNOWN) ||
                 (m_connect_resource_type == APX_RESOURCE_TYPE_ERROR))
            {
               return ARGPARSE_VALUE_ERROR;
            }
         }
         else if (strcmp(short_name, "i") == 0)
         {
            m_input_file_path = adt_str_new_cstr(value);
            if (m_input_file_path == 0)
            {
               return ARGPARSE_MEM_ERROR;
            }
         }
         else
         {
            return ARGPARSE_PARSE_ERROR;
         }
      }
      else if (long_name != 0)
      {
         char *end;
         long lval;
         if (strcmp(long_name,"port")==0)
         {
            lval = strtol(value, &end, 0);
            if ( (end > value) && (lval <= UINT16_MAX))
            {
               m_connect_port = (uint16_t) lval;
            }
            else
            {
               return ARGPARSE_VALUE_ERROR;
            }
         }
         else if (strcmp(long_name,"connect")==0)
         {
            if (m_connect_address != 0) adt_str_delete(m_connect_address);
            m_connect_resource_type = apx_parse_resource_name(value, &m_connect_address, &m_connect_port);
            if ( (m_connect_resource_type == APX_RESOURCE_TYPE_UNKNOWN) ||
                 (m_connect_resource_type == APX_RESOURCE_TYPE_ERROR))
            {
               return ARGPARSE_VALUE_ERROR;
            }
         }
      }
      else
      {
         adt_str_t *tmp = adt_str_new_cstr(value);
         if (tmp == 0)
         {
            return ARGPARSE_MEM_ERROR;
         }
         if (m_pos_arg_count==0u)
         {
            m_name = tmp;
         }
         else if (m_pos_arg_count==1u)
         {
            m_value = tmp;
         }
         else
         {
            adt_str_delete(tmp);
            return ARGPARSE_PARSE_ERROR;
         }
         m_pos_arg_count++;
      }
   }
   return ARGPARSE_SUCCESS;
}